

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
fasttext::Model::State::State(State *this,int32_t hiddenSize,int32_t outputSize,int32_t seed)

{
  this->lossValue_ = 0.0;
  this->nexamples_ = 0;
  Vector::Vector(&this->hidden,(long)hiddenSize);
  Vector::Vector(&this->output,(long)outputSize);
  Vector::Vector(&this->grad,(long)hiddenSize);
  (this->rng)._M_x = (ulong)(long)seed % 0x7fffffff + (ulong)((ulong)(long)seed % 0x7fffffff == 0);
  return;
}

Assistant:

Model::State::State(int32_t hiddenSize, int32_t outputSize, int32_t seed)
    : lossValue_(0.0),
      nexamples_(0),
      hidden(hiddenSize),
      output(outputSize),
      grad(hiddenSize),
      rng(seed) {}